

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void arg_print_glossary(FILE *fp,void **argtable,char *format)

{
  arg_dstr_t ds;
  
  ds = (arg_dstr_t)malloc(0xf0);
  if (ds == (arg_dstr_t)0x0) {
    (*s_panic)("Out of memory!\n");
  }
  memset(ds,0,0xf0);
  ds->data = ds->sbuf;
  ds->free_proc = (arg_dstr_freefn *)0x0;
  arg_print_glossary_ds(ds,argtable,format);
  fputs(ds->data,(FILE *)fp);
  arg_dstr_reset(ds);
  free(ds);
  return;
}

Assistant:

void arg_print_glossary(FILE* fp, void** argtable, const char* format) {
    arg_dstr_t ds = arg_dstr_create();
    arg_print_glossary_ds(ds, argtable, format);
    fputs(arg_dstr_cstr(ds), fp);
    arg_dstr_destroy(ds);
}